

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
AdapterPromiseNode<capnproto_test::capnp::test::TestMembrane::Client,_kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestMembrane::Client>_>
::fulfill(AdapterPromiseNode<capnproto_test::capnp::test::TestMembrane::Client,_kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestMembrane::Client>_>
          *this,Client *value)

{
  _func_int *p_Var1;
  undefined8 uVar2;
  undefined1 local_1c0 [440];
  
  if (this->waiting == true) {
    this->waiting = false;
    local_1c0[0] = false;
    local_1c0[0x198] = true;
    p_Var1 = (_func_int *)((long)&value->_vptr_Client + (long)value->_vptr_Client[-3]);
    local_1c0._424_8_ = *(undefined8 *)p_Var1;
    local_1c0._432_8_ = *(undefined8 *)(p_Var1 + 8);
    *(undefined8 *)(&value->field_0x8 + (long)value->_vptr_Client[-3]) = 0;
    local_1c0._416_8_ = &capnproto_test::capnp::test::TestMembrane::Client::typeinfo;
    ExceptionOr<capnproto_test::capnp::test::TestMembrane::Client>::operator=
              (&this->result,
               (ExceptionOr<capnproto_test::capnp::test::TestMembrane::Client> *)local_1c0);
    uVar2 = local_1c0._432_8_;
    if ((local_1c0[0x198] == true) && ((long *)local_1c0._432_8_ != (long *)0x0)) {
      local_1c0._432_8_ = (long *)0x0;
      (*(code *)**(undefined8 **)local_1c0._424_8_)
                (local_1c0._424_8_,uVar2 + *(long *)(*(long *)uVar2 + -0x10));
    }
    if (local_1c0[0] == true) {
      Exception::~Exception((Exception *)(local_1c0 + 8));
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }